

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
calculator::UnaryFunctionException::~UnaryFunctionException(UnaryFunctionException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_00118718;
  pcVar2 = (this->super_ValueException).super_SyntaxError.error_msg._M_dataplus._M_p;
  paVar1 = &(this->super_ValueException).super_SyntaxError.error_msg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

UnaryFunctionException(const std::string& functionname) {
        error_msg = "Error: unary function [" + functionname +
                    "] must have an operator number ";
    }